

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aligned_containers.h
# Opt level: O3

ThreadEntry * __thiscall
density_tests::
aligned_allocator<density_tests::HeterLoadUnloadTest<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadEntry>
::allocate(aligned_allocator<density_tests::HeterLoadUnloadTest<density::lf_heter_queue<density::runtime_type<>,_density::basic_default_allocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>::ThreadEntry>
           *this,size_t i_count)

{
  uintptr_t uint_pointer_1;
  ThreadEntry *pTVar1;
  uintptr_t uint_pointer;
  ThreadEntry *pTVar2;
  
  pTVar1 = (ThreadEntry *)operator_new(i_count * 0x40 + 0x40);
  *(ThreadEntry **)(((ulong)pTVar1 & 0xffffffffffffffc0) + 0x38) = pTVar1;
  pTVar2 = (ThreadEntry *)(((ulong)pTVar1 & 0xffffffffffffffc0) + 0x40);
  if ((pTVar2 < pTVar1) || (pTVar1 + i_count + 1 < pTVar2 + i_count)) {
    detail::assert_failed<>
              ("user_block >= complete_block && address_add(user_block, i_size) <= address_add(complete_block, actual_size)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/density_common.h"
               ,0x1e5);
  }
  return pTVar2;
}

Assistant:

TYPE * allocate(std::size_t i_count)
        {
            return static_cast<TYPE *>(
              density::aligned_allocate(i_count * sizeof(TYPE), alignof(TYPE)));
        }